

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcRedirectFunction(uint sourceId,uint targetId)

{
  void *pvVar1;
  int iVar2;
  ExternFuncInfo *pEVar3;
  ExternFuncInfo *pEVar4;
  
  if (NULLC::initialized != '\0') {
    if (NULLC::currExec == 1) {
      ExecutorX86::UpdateFunctionPointer(NULLC::executorX86,sourceId,targetId);
    }
    pEVar3 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),sourceId
                       );
    pEVar4 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),targetId
                       );
    iVar2 = pEVar4->regVmCodeSize;
    pEVar3->regVmAddress = pEVar4->regVmAddress;
    pEVar3->regVmCodeSize = iVar2;
    pEVar3->regVmRegisters = pEVar4->regVmRegisters;
    pvVar1 = pEVar4->funcPtrWrapTarget;
    pEVar3->funcPtrRaw = pEVar4->funcPtrRaw;
    pEVar3->funcPtrWrapTarget = pvVar1;
    pEVar3->funcPtrWrap = pEVar4->funcPtrWrap;
    return '\x01';
  }
  NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  return '\0';
}

Assistant:

nullres nullcRedirectFunction(unsigned sourceId, unsigned targetId)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		executorX86->UpdateFunctionPointer(sourceId, targetId);
#endif

	ExternFuncInfo &destFunc = linker->exFunctions[sourceId];
	ExternFuncInfo &srcFunc = linker->exFunctions[targetId];

	destFunc.regVmAddress = srcFunc.regVmAddress;
	destFunc.regVmCodeSize = srcFunc.regVmCodeSize;
	destFunc.regVmRegisters = srcFunc.regVmRegisters;

	destFunc.funcPtrRaw = srcFunc.funcPtrRaw;
	destFunc.funcPtrWrapTarget = srcFunc.funcPtrWrapTarget;
	destFunc.funcPtrWrap = srcFunc.funcPtrWrap;

	return true;
}